

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObject.cpp
# Opt level: O0

BOOL __thiscall
Js::DynamicObject::SetObjectArrayItemAttributes
          (DynamicObject *this,uint32 index,PropertyAttributes attributes)

{
  bool bVar1;
  int iVar2;
  ArrayObject *pAVar3;
  bool bVar4;
  bool result;
  PropertyAttributes attributes_local;
  uint32 index_local;
  DynamicObject *this_local;
  
  bVar1 = HasObjectArray(this);
  bVar4 = false;
  if (bVar1) {
    pAVar3 = GetObjectArrayOrFlagsAsArray(this);
    iVar2 = (*(pAVar3->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6c])
                      (pAVar3,(ulong)index,(ulong)attributes);
    bVar4 = iVar2 != 0;
  }
  if (((attributes & 4) == 0) && (bVar4)) {
    InvalidateHasOnlyWritableDataPropertiesInPrototypeChainCacheIfPrototype(this);
  }
  return (BOOL)bVar4;
}

Assistant:

BOOL DynamicObject::SetObjectArrayItemAttributes(uint32 index, PropertyAttributes attributes)
    {
        const auto result = HasObjectArray() && GetObjectArrayOrFlagsAsArray()->SetItemAttributes(index, attributes);

        // We don't track non-enumerable items in object arrays.  Any object with an object array reports having
        // enumerable properties.  See comment in DynamicObject::GetHasNoEnumerableProperties.
        //if (attributes & PropertyEnumerable)
        //{
        //    SetHasNoEnumerableProperties(false);
        //}

        if (!(attributes & PropertyWritable) && result)
        {
            InvalidateHasOnlyWritableDataPropertiesInPrototypeChainCacheIfPrototype();
        }
        return result;
    }